

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMAttrMapImpl::setReadOnly(DOMAttrMapImpl *this,bool readOnl,bool deep)

{
  XMLSize_t XVar1;
  DOMNode *pDVar2;
  long *plVar3;
  long lVar4;
  DOMNodeImpl *this_00;
  DOMException *this_01;
  undefined7 in_register_00000011;
  ulong uVar5;
  
  if ((((int)CONCAT71(in_register_00000011,deep) != 0) && (this->fNodes != (DOMNodeVector *)0x0)) &&
     (XVar1 = this->fNodes->nextFreeSlot, XVar1 != 0)) {
    uVar5 = 0;
    do {
      if ((this->fNodes->nextFreeSlot <= uVar5) ||
         (pDVar2 = this->fNodes->data[uVar5], pDVar2 == (DOMNode *)0x0)) {
LAB_0025ac12:
        this_01 = (DOMException *)__cxa_allocate_exception(0x28);
        DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
        __cxa_throw(this_01,&DOMException::typeinfo,DOMException::~DOMException);
      }
      plVar3 = (long *)__dynamic_cast(pDVar2,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                      0xfffffffffffffffe);
      if (plVar3 == (long *)0x0) goto LAB_0025ac12;
      lVar4 = (**(code **)(*plVar3 + 0x10))(plVar3);
      if (lVar4 == 0) goto LAB_0025ac12;
      this_00 = (DOMNodeImpl *)(**(code **)(*plVar3 + 0x10))(plVar3);
      DOMNodeImpl::setReadOnly(this_00,readOnl,true);
      uVar5 = uVar5 + 1;
    } while (XVar1 != uVar5);
  }
  return;
}

Assistant:

void DOMAttrMapImpl::setReadOnly(bool readOnl, bool deep)
{
    // this->fReadOnly=readOnl;
    if(deep && fNodes!=0)
    {
        XMLSize_t sz = fNodes->size();
        for (XMLSize_t i=0; i<sz; ++i) {
            castToNodeImpl(fNodes->elementAt(i))->setReadOnly(readOnl, deep);
        }
    }
}